

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O1

int mbedtls_oid_get_numeric_string(char *buf,size_t size,mbedtls_asn1_buf *oid)

{
  byte bVar1;
  uint uVar2;
  uint in_ECX;
  ulong uVar3;
  ulong uVar4;
  size_t n;
  char *p;
  ulong __maxlen;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  
  uVar5 = 0xffffff9c;
  if (size < 0x80000000) {
    if (oid->len == 0) {
      uVar5 = 0xffffffa0;
    }
    else {
      bVar8 = false;
      bVar7 = oid->len != 0;
      __maxlen = size;
      if (bVar7) {
        uVar6 = 1;
        uVar5 = 0;
        do {
          bVar1 = oid->p[uVar6 - 1];
          in_ECX = (uint)bVar1;
          uVar5 = bVar1 & 0x7f | uVar5 << 7;
          uVar3 = __maxlen;
          if (-1 < (char)bVar1) {
            if (__maxlen == size) {
              if (uVar5 < 0x50) {
                uVar3 = (ulong)(0x31 - (uVar5 < 0x28));
                uVar4 = (ulong)(uVar5 - 0x28);
                if (uVar5 < 0x28) {
                  uVar4 = (ulong)uVar5;
                }
              }
              else {
                uVar4 = (ulong)(uVar5 - 0x50);
                uVar3 = 0x32;
              }
              uVar2 = snprintf(buf,__maxlen,"%c.%u",uVar3,uVar4);
            }
            else {
              uVar2 = snprintf(buf,__maxlen,".%u",(ulong)uVar5);
            }
            in_ECX = 0xfffffff5;
            if ((int)uVar2 < 2) goto LAB_001c1d83;
            uVar4 = (ulong)uVar2;
            uVar3 = __maxlen - uVar4;
            if (__maxlen < uVar4 || uVar3 == 0) goto LAB_001c1d83;
            buf = buf + uVar4;
            uVar5 = 0;
          }
          bVar7 = uVar6 < oid->len;
          __maxlen = uVar3;
          if (!bVar7) goto LAB_001c1d83;
          uVar6 = uVar6 + 1;
        } while (uVar5 < 0x2000000);
        uVar5 = 1;
        in_ECX = 0xffffff98;
LAB_001c1d83:
        bVar8 = uVar5 != 0;
      }
      uVar5 = in_ECX;
      if ((!bVar7) && (uVar5 = 0xffffffa0, !bVar8)) {
        uVar5 = (int)size - (int)__maxlen;
      }
    }
  }
  return uVar5;
}

Assistant:

int mbedtls_oid_get_numeric_string(char *buf, size_t size,
                                   const mbedtls_asn1_buf *oid)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    char *p = buf;
    size_t n = size;
    unsigned int value = 0;

    if (size > INT_MAX) {
        /* Avoid overflow computing return value */
        return MBEDTLS_ERR_ASN1_INVALID_LENGTH;
    }

    if (oid->len <= 0) {
        /* OID must not be empty */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    for (size_t i = 0; i < oid->len; i++) {
        /* Prevent overflow in value. */
        if (value > (UINT_MAX >> 7)) {
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }
        if ((value == 0) && ((oid->p[i]) == 0x80)) {
            /* Overlong encoding is not allowed */
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }

        value <<= 7;
        value |= oid->p[i] & 0x7F;

        if (!(oid->p[i] & 0x80)) {
            /* Last byte */
            if (n == size) {
                int component1;
                unsigned int component2;
                /* First subidentifier contains first two OID components */
                if (value >= 80) {
                    component1 = '2';
                    component2 = value - 80;
                } else if (value >= 40) {
                    component1 = '1';
                    component2 = value - 40;
                } else {
                    component1 = '0';
                    component2 = value;
                }
                ret = mbedtls_snprintf(p, n, "%c.%u", component1, component2);
            } else {
                ret = mbedtls_snprintf(p, n, ".%u", value);
            }
            if (ret < 2 || (size_t) ret >= n) {
                return MBEDTLS_ERR_OID_BUF_TOO_SMALL;
            }
            n -= (size_t) ret;
            p += ret;
            value = 0;
        }
    }

    if (value != 0) {
        /* Unterminated subidentifier */
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    return (int) (size - n);
}